

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::ARTIteratorTest,_testing::internal::TemplateSel<(anonymous_namespace)::ARTIteratorTest_I4AndTwoLeavesForwardScan_Test>,_testing::internal::Types<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  pointer pcVar1;
  char *pcVar2;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  TestFactoryBase *pTVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  size_t sVar11;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *ptVar12;
  _Alloc_hider _Var13;
  undefined4 in_register_00000084;
  type_info *ptVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long lVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  type_info *ptVar18;
  type_info *ptVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  size_type __dnew_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  CodeLocation local_398;
  char *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  type_info *local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  CodeLocation local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  int local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  type_info *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  CodeLocation *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  int local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  _Alloc_hider local_168;
  size_type __dnew_1;
  undefined1 local_158;
  undefined7 uStack_157;
  undefined8 uStack_150;
  int local_148;
  string local_140;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  size_type __dnew_2;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  int local_b8;
  CodeLocation local_b0;
  undefined1 local_88 [8];
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  int local_68;
  GTestLog local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_218 = code_location;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"","",test_names,CONCAT44(in_register_00000084,index));
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100._M_p = (pointer)&stack0xffffffffffffff10;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar17 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar17) {
    local_f0 = paVar17->_M_allocated_capacity;
    uStack_e8 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f0 = paVar17->_M_allocated_capacity;
    local_100._M_p = pcVar1;
  }
  __dnew_2 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffff00,"ARTIteratorTest");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar17;
  }
  local_d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,"/");
  local_b0.file._M_dataplus._M_p = (pointer)&local_b0.file.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_b0.file.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_b0.file.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.file._M_dataplus._M_p = (pointer)paVar17;
  }
  local_b0.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0.file,*(char **)(pcVar1 + 0x20),*(size_type *)(pcVar1 + 0x28));
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_2e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_2e8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2e8._M_dataplus._M_p = (pointer)paVar17;
  }
  local_2e8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"I4AndTwoLeavesForwardScan","");
  ptVar12 = extraout_RDX;
  paVar17 = local_238;
  if (local_230 != (type_info *)0x0) {
    ptVar14 = local_230 + (long)local_238;
    do {
      paVar10 = local_238;
      iVar7 = isspace((uint)(byte)ptVar14[-1]);
      ptVar12 = extraout_RDX_00;
      paVar17 = paVar10;
      if (iVar7 == 0) break;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar14 + -1);
      lVar16 = (long)paVar15 - (long)paVar10;
      if ((local_230 != (type_info *)(lVar16 + 1)) &&
         (sVar11 = (long)local_230 - (lVar16 + 1), sVar11 != 0)) {
        ptVar12 = (type_info *)(paVar10->_M_local_buf + lVar16);
        if (sVar11 == 1) {
          *ptVar12 = ptVar12[1];
        }
        else {
          memmove(ptVar12,(type_info *)(paVar10->_M_local_buf + lVar16 + 1),sVar11);
        }
      }
      ptVar12 = local_230 + -1;
      ((type_info *)(local_238->_M_local_buf + -1))[(long)local_230] = (type_info)0x0;
      ptVar14 = (type_info *)(local_238->_M_local_buf + lVar16);
      paVar17 = local_238;
      local_230 = ptVar12;
    } while (paVar15 != paVar10);
  }
  local_238 = &local_228;
  if (paVar17 == local_238) {
    uStack_150 = local_228._8_8_;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&stack0xfffffffffffffea8;
  }
  uStack_157 = local_228._M_allocated_capacity._1_7_;
  local_158 = local_228._M_local_buf[0];
  __dnew_1 = (size_type)local_230;
  local_230 = (type_info *)0x0;
  local_228._M_local_buf[0] = '\0';
  local_168._M_p = (pointer)paVar17;
  GetTypeName_abi_cxx11_
            ((string *)local_88,
             (internal *)
             &unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
              typeinfo,ptVar12);
  local_370 = (char *)local_88;
  local_398.file._M_dataplus._M_p = (pointer)&local_398.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_398,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar7 = *(int *)(prefix + 0x20);
  pcVar2 = *(char **)prefix;
  local_398.line = iVar7;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2c8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2c8);
  }
  pcVar2 = *(char **)prefix;
  iVar7 = *(int *)(prefix + 0x20);
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2c8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2c8);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00251558;
  MakeAndRegisterTestInfo
            (&local_2e8,paVar17->_M_local_buf,local_370,(char *)0x0,&local_398,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.file._M_dataplus._M_p != &local_398.file.field_2) {
    operator_delete(local_398.file._M_dataplus._M_p,local_398.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_88 != (undefined1  [8])&local_78) {
    operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xfffffffffffffea8) {
    operator_delete(local_168._M_p,_local_158 + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,
                    CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.file._M_dataplus._M_p != &local_b0.file.field_2) {
    operator_delete(local_b0.file._M_dataplus._M_p,local_b0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_100._M_p != (pointer)&stack0xffffffffffffff10) {
    operator_delete(local_100._M_p,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_260 = &local_250;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(prefix + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)prefix == paVar17) {
    local_250._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_250._8_8_ = *(undefined8 *)(prefix + 0x18);
  }
  else {
    local_250._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_260 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)prefix;
  }
  local_258 = *(size_type *)(prefix + 8);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)prefix = paVar17;
  prefix[8] = '\0';
  prefix[9] = '\0';
  prefix[10] = '\0';
  prefix[0xb] = '\0';
  prefix[0xc] = '\0';
  prefix[0xd] = '\0';
  prefix[0xe] = '\0';
  prefix[0xf] = '\0';
  prefix[0x10] = '\0';
  local_240 = *(int *)(prefix + 0x20);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100._M_p = (pointer)&stack0xffffffffffffff10;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar17 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar17) {
    local_f0 = paVar17->_M_allocated_capacity;
    uStack_e8 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f0 = paVar17->_M_allocated_capacity;
    local_100._M_p = pcVar1;
  }
  __dnew_2 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffff00,"ARTIteratorTest");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar17;
  }
  local_d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,"/");
  local_b0.file._M_dataplus._M_p = (pointer)&local_b0.file.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_b0.file.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_b0.file.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.file._M_dataplus._M_p = (pointer)paVar17;
  }
  local_b0.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0.file,*(char **)(pcVar1 + 0x40),*(size_type *)(pcVar1 + 0x48));
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_308.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_308.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_308.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_308._M_dataplus._M_p = (pointer)paVar17;
  }
  local_308._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_88 = (undefined1  [8])0x19;
  local_188._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_188,(size_type *)local_88,0);
  local_188.field_2._M_allocated_capacity = (size_type)local_88;
  *(undefined8 *)(local_188._M_dataplus._M_p + 9) = 0x726f467365766165;
  *(undefined8 *)(local_188._M_dataplus._M_p + 0x11) = 0x6e61635364726177;
  *(undefined8 *)local_188._M_dataplus._M_p = 0x6f7754646e413449;
  *(undefined8 *)(local_188._M_dataplus._M_p + 8) = 0x6f4673657661654c;
  local_188._M_string_length = (size_type)local_88;
  *(type_info *)(local_188._M_dataplus._M_p + (long)local_88) = (type_info)0x0;
  ptVar12 = extraout_RDX_01;
  _Var13._M_p = local_188._M_dataplus._M_p;
  if (local_88 != (undefined1  [8])0x0) {
    ptVar14 = (type_info *)((long)local_88 + (long)local_188._M_dataplus._M_p);
    do {
      _Var4._M_p = local_188._M_dataplus._M_p;
      iVar7 = isspace((uint)(byte)ptVar14[-1]);
      ptVar12 = extraout_RDX_02;
      _Var13._M_p = _Var4._M_p;
      if (iVar7 == 0) break;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar14 + -1);
      lVar16 = (long)paVar17 - (long)_Var4._M_p;
      if (((type_info *)local_188._M_string_length != (type_info *)(lVar16 + 1)) &&
         (sVar11 = local_188._M_string_length - (lVar16 + 1), sVar11 != 0)) {
        ptVar12 = (type_info *)(_Var4._M_p + lVar16);
        if (sVar11 == 1) {
          *ptVar12 = ptVar12[1];
        }
        else {
          memmove(ptVar12,(type_info *)(_Var4._M_p + lVar16 + 1),sVar11);
        }
      }
      ptVar12 = (type_info *)(local_188._M_string_length + -1);
      ((type_info *)(local_188._M_dataplus._M_p + -1))[local_188._M_string_length] = (type_info)0x0;
      ptVar14 = (type_info *)(local_188._M_dataplus._M_p + lVar16);
      _Var13._M_p = local_188._M_dataplus._M_p;
      local_188._M_string_length = (size_type)ptVar12;
    } while (paVar17 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var4._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  if (_Var13._M_p == local_188._M_dataplus._M_p) {
    uStack_150 = local_188.field_2._8_8_;
    _Var13._M_p = (pointer)&stack0xfffffffffffffea8;
  }
  _local_158 = local_188.field_2._M_allocated_capacity;
  __dnew_1 = local_188._M_string_length;
  local_188._M_string_length = 0;
  local_188.field_2._M_allocated_capacity =
       local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_168._M_p = _Var13._M_p;
  GetTypeName_abi_cxx11_
            ((string *)local_88,
             (internal *)
             &unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
              typeinfo,ptVar12);
  auVar3 = local_88;
  local_2c8.file._M_dataplus._M_p = (pointer)&local_2c8.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_260,local_258 + (long)local_260);
  iVar7 = local_240;
  paVar17 = local_260;
  local_2c8.line = local_240;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (paVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(paVar17->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar17->_M_local_buf,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_210);
  }
  iVar7 = local_240;
  paVar17 = local_260;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (paVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(paVar17->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar17->_M_local_buf,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_210);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002515f0;
  MakeAndRegisterTestInfo
            (&local_308,_Var13._M_p,(char *)auVar3,(char *)0x0,&local_2c8,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.file._M_dataplus._M_p != &local_2c8.file.field_2) {
    operator_delete(local_2c8.file._M_dataplus._M_p,local_2c8.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_88 != (undefined1  [8])&local_78) {
    operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xfffffffffffffea8) {
    operator_delete(local_168._M_p,(size_t)(_local_158 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.file._M_dataplus._M_p != &local_b0.file.field_2) {
    operator_delete(local_b0.file._M_dataplus._M_p,local_b0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_100._M_p != (pointer)&stack0xffffffffffffff10) {
    operator_delete(local_100._M_p,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_210 = &local_200;
  if (local_260 == &local_250) {
    local_200._8_8_ = local_250._8_8_;
  }
  else {
    local_210 = local_260;
  }
  local_200._M_allocated_capacity = local_250._M_allocated_capacity;
  local_208 = local_258;
  local_258 = 0;
  local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
  local_1f0 = local_240;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_260 = &local_250;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100._M_p = (pointer)&stack0xffffffffffffff10;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar17 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar17) {
    local_f0 = paVar17->_M_allocated_capacity;
    uStack_e8 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f0 = paVar17->_M_allocated_capacity;
    local_100._M_p = pcVar1;
  }
  __dnew_2 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffff00,"ARTIteratorTest");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar17;
  }
  local_d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,"/");
  local_b0.file._M_dataplus._M_p = (pointer)&local_b0.file.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_b0.file.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_b0.file.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.file._M_dataplus._M_p = (pointer)paVar17;
  }
  local_b0.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0.file,*(char **)(pcVar1 + 0x60),*(size_type *)(pcVar1 + 0x68));
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_328.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_328.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_328.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_328._M_dataplus._M_p = (pointer)paVar17;
  }
  local_328._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_168._M_p = (pointer)0x19;
  local_1a8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_1a8,(size_type *)&stack0xfffffffffffffe98,0);
  local_1a8.field_2._M_allocated_capacity = (size_type)local_168._M_p;
  *(undefined8 *)(local_1a8._M_dataplus._M_p + 9) = 0x726f467365766165;
  *(undefined8 *)(local_1a8._M_dataplus._M_p + 0x11) = 0x6e61635364726177;
  *(undefined8 *)local_1a8._M_dataplus._M_p = 0x6f7754646e413449;
  *(undefined8 *)(local_1a8._M_dataplus._M_p + 8) = 0x6f4673657661654c;
  local_1a8._M_string_length = (size_type)local_168._M_p;
  *(type_info *)(local_1a8._M_dataplus._M_p + (long)local_168._M_p) = (type_info)0x0;
  ptVar12 = extraout_RDX_03;
  _Var13._M_p = local_1a8._M_dataplus._M_p;
  if ((type_info *)local_168._M_p != (type_info *)0x0) {
    ptVar14 = (type_info *)(local_168._M_p + (long)local_1a8._M_dataplus._M_p);
    do {
      _Var4._M_p = local_1a8._M_dataplus._M_p;
      iVar7 = isspace((uint)(byte)ptVar14[-1]);
      ptVar12 = extraout_RDX_04;
      _Var13._M_p = _Var4._M_p;
      if (iVar7 == 0) break;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar14 + -1);
      lVar16 = (long)paVar17 - (long)_Var4._M_p;
      if (((type_info *)local_1a8._M_string_length != (type_info *)(lVar16 + 1)) &&
         (sVar11 = local_1a8._M_string_length - (lVar16 + 1), sVar11 != 0)) {
        ptVar12 = (type_info *)(_Var4._M_p + lVar16);
        if (sVar11 == 1) {
          *ptVar12 = ptVar12[1];
        }
        else {
          memmove(ptVar12,(type_info *)(_Var4._M_p + lVar16 + 1),sVar11);
        }
      }
      ptVar12 = (type_info *)(local_1a8._M_string_length + -1);
      ((type_info *)(local_1a8._M_dataplus._M_p + -1))[local_1a8._M_string_length] = (type_info)0x0;
      ptVar14 = (type_info *)(local_1a8._M_dataplus._M_p + lVar16);
      _Var13._M_p = local_1a8._M_dataplus._M_p;
      local_1a8._M_string_length = (size_type)ptVar12;
    } while (paVar17 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var4._M_p);
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  if (_Var13._M_p == local_1a8._M_dataplus._M_p) {
    local_78._8_8_ = local_1a8.field_2._8_8_;
    _Var13._M_p = (pointer)&local_78;
  }
  local_78._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
  __dnew = local_1a8._M_string_length;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity =
       local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_88 = (undefined1  [8])_Var13._M_p;
  GetTypeName_abi_cxx11_
            (&local_140,
             (internal *)
             &unodb::
              db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar12);
  _Var4._M_p = local_140._M_dataplus._M_p;
  local_168._M_p = &stack0xfffffffffffffea8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffe98,local_210,local_208 + (long)local_210);
  iVar7 = local_1f0;
  paVar17 = local_210;
  local_148 = local_1f0;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)local_120,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (paVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(paVar17->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar17->_M_local_buf,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)local_120);
  }
  iVar7 = local_1f0;
  paVar17 = local_210;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)local_120,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (paVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(paVar17->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar17->_M_local_buf,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)local_120);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00251688;
  MakeAndRegisterTestInfo
            (&local_328,_Var13._M_p,_Var4._M_p,(char *)0x0,(CodeLocation *)&stack0xfffffffffffffe98,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if (local_168._M_p != &stack0xfffffffffffffea8) {
    operator_delete(local_168._M_p,(size_t)(_local_158 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != (undefined1  [8])&local_78) {
    operator_delete((void *)local_88,(size_t)(local_78._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.file._M_dataplus._M_p != &local_b0.file.field_2) {
    operator_delete(local_b0.file._M_dataplus._M_p,local_b0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_100._M_p != (pointer)&stack0xffffffffffffff10) {
    operator_delete(local_100._M_p,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_88 = (undefined1  [8])&local_78;
  if (local_210 == &local_200) {
    local_78._8_8_ = local_200._8_8_;
  }
  else {
    local_88 = (undefined1  [8])local_210;
  }
  local_78._M_allocated_capacity = local_200._M_allocated_capacity;
  __dnew = local_208;
  local_208 = 0;
  local_200._M_allocated_capacity = local_200._M_allocated_capacity & 0xffffffffffffff00;
  local_68 = local_1f0;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_allocated_capacity =
       local_140.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_210 = &local_200;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_140,"");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)paVar17;
  }
  local_58._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"ARTIteratorTest");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar17;
  }
  local_d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,"/");
  local_b0.file._M_dataplus._M_p = (pointer)&local_b0.file.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_b0.file.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_b0.file.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_b0.file._M_dataplus._M_p = (pointer)paVar17;
  }
  local_b0.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0.file,*(char **)(pcVar1 + 0x80),*(size_type *)(pcVar1 + 0x88));
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_348.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_348.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_348.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_348._M_dataplus._M_p = (pointer)paVar17;
  }
  local_348._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1c8._0_8_ = local_1c8 + 0x10;
  local_100._M_p = (pointer)0x19;
  local_1c8._0_8_ =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                  (size_type *)&stack0xffffffffffffff00,0);
  local_1b8._M_allocated_capacity = (size_type)local_100._M_p;
  *(undefined8 *)(local_1c8._0_8_ + 9) = 0x726f467365766165;
  *(undefined8 *)(local_1c8._0_8_ + 0x11) = 0x6e61635364726177;
  *(undefined8 *)local_1c8._0_8_ = 0x6f7754646e413449;
  *(undefined8 *)(local_1c8._0_8_ + 8) = 0x6f4673657661654c;
  local_1c8._8_8_ = local_100._M_p;
  *(type_info *)(local_1c8._0_8_ + (long)local_100._M_p) = (type_info)0x0;
  ptVar12 = extraout_RDX_05;
  ptVar14 = (type_info *)local_1c8._0_8_;
  if ((type_info *)local_100._M_p != (type_info *)0x0) {
    ptVar18 = (type_info *)(local_100._M_p + local_1c8._0_8_);
    do {
      uVar5 = local_1c8._0_8_;
      iVar7 = isspace((uint)(byte)ptVar18[-1]);
      ptVar12 = extraout_RDX_06;
      ptVar14 = (type_info *)uVar5;
      if (iVar7 == 0) break;
      ptVar19 = ptVar18 + -1;
      lVar16 = (long)ptVar19 - uVar5;
      if (((type_info *)local_1c8._8_8_ != (type_info *)(lVar16 + 1)) &&
         (sVar11 = local_1c8._8_8_ - (lVar16 + 1), sVar11 != 0)) {
        ptVar12 = (type_info *)(uVar5 + lVar16);
        if (sVar11 == 1) {
          *ptVar12 = ptVar12[1];
        }
        else {
          memmove(ptVar12,(type_info *)(uVar5 + lVar16 + 1),sVar11);
        }
      }
      ptVar12 = (type_info *)(local_1c8._8_8_ + -1);
      ((type_info *)(local_1c8._0_8_ + -1))[local_1c8._8_8_] = (type_info)0x0;
      ptVar18 = (type_info *)(local_1c8._0_8_ + lVar16);
      ptVar14 = (type_info *)local_1c8._0_8_;
      local_1c8._8_8_ = ptVar12;
    } while (ptVar19 != (type_info *)uVar5);
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  if (ptVar14 == (type_info *)local_1c8._0_8_) {
    local_110._8_8_ = local_1b8._8_8_;
    ptVar14 = (type_info *)(local_120 + 0x10);
  }
  local_110._M_allocated_capacity = local_1b8._M_allocated_capacity;
  local_120._8_8_ = local_1c8._8_8_;
  local_1c8._8_8_ = 0;
  local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
  local_120._0_8_ = ptVar14;
  GetTypeName_abi_cxx11_
            (&local_280,
             (internal *)
             &unodb::
              mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar12);
  _Var13._M_p = local_280._M_dataplus._M_p;
  local_100._M_p = (pointer)&stack0xffffffffffffff10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff00,local_88,(char *)((long)local_88 + __dnew));
  iVar7 = local_68;
  auVar3 = local_88;
  local_e0 = local_68;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2a0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (auVar3 == (undefined1  [8])0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen((char *)auVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)auVar3,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2a0);
  }
  iVar7 = local_68;
  auVar3 = local_88;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2a0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (auVar3 == (undefined1  [8])0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen((char *)auVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)auVar3,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2a0);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00251720;
  MakeAndRegisterTestInfo
            (&local_348,(char *)ptVar14,_Var13._M_p,(char *)0x0,
             (CodeLocation *)&stack0xffffffffffffff00,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if (local_100._M_p != (pointer)&stack0xffffffffffffff10) {
    operator_delete(local_100._M_p,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((type_info *)local_120._0_8_ != (type_info *)(local_120 + 0x10)) {
    operator_delete((void *)local_120._0_8_,(size_t)(local_110._M_allocated_capacity + 1));
  }
  if ((type_info *)local_1c8._0_8_ != (type_info *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.file._M_dataplus._M_p != &local_b0.file.field_2) {
    operator_delete(local_b0.file._M_dataplus._M_p,local_b0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  if (local_88 == (undefined1  [8])&local_78) {
    local_58.field_2._8_8_ = local_78._8_8_;
  }
  else {
    local_58._M_dataplus._M_p = (pointer)local_88;
  }
  local_58.field_2._M_allocated_capacity = local_78._M_allocated_capacity;
  local_58._M_string_length = __dnew;
  __dnew = 0;
  local_78._M_allocated_capacity = local_78._M_allocated_capacity & 0xffffffffffffff00;
  local_38 = local_68;
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  local_3d8._M_string_length = 0;
  local_3d8.field_2._M_local_buf[0] = '\0';
  local_88 = (undefined1  [8])&local_78;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_3d8,"");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_2a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_2a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2a0._M_dataplus._M_p = (pointer)paVar17;
  }
  local_2a0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a0,"ARTIteratorTest");
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_280.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_280.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_280.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_280._M_dataplus._M_p = (pointer)paVar17;
  }
  local_280._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_280,"/");
  local_120._0_8_ = local_120 + 0x10;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar17 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar17) {
    local_110._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_110._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_110._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_120._0_8_ = pcVar1;
  }
  local_120._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     *(char **)(pcVar1 + 0xa0),*(size_type *)(pcVar1 + 0xa8));
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar17 == paVar10) {
    local_140.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_140.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_140._M_dataplus._M_p = (pointer)paVar17;
  }
  local_140._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_3b8 = (undefined1  [8])0x19;
  local_1e8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_1e8,(size_type *)local_3b8,0);
  local_1e8.field_2._M_allocated_capacity = (size_type)local_3b8;
  *(undefined8 *)(local_1e8._M_dataplus._M_p + 9) = 0x726f467365766165;
  *(undefined8 *)(local_1e8._M_dataplus._M_p + 0x11) = 0x6e61635364726177;
  *(undefined8 *)local_1e8._M_dataplus._M_p = 0x6f7754646e413449;
  *(undefined8 *)(local_1e8._M_dataplus._M_p + 8) = 0x6f4673657661654c;
  local_1e8._M_string_length = (size_type)local_3b8;
  *(type_info *)(local_1e8._M_dataplus._M_p + (long)local_3b8) = (type_info)0x0;
  ptVar12 = extraout_RDX_07;
  _Var13._M_p = local_1e8._M_dataplus._M_p;
  if (local_3b8 != (undefined1  [8])0x0) {
    ptVar14 = (type_info *)((long)local_3b8 + (long)local_1e8._M_dataplus._M_p);
    do {
      _Var4._M_p = local_1e8._M_dataplus._M_p;
      iVar7 = isspace((uint)(byte)ptVar14[-1]);
      ptVar12 = extraout_RDX_08;
      _Var13._M_p = _Var4._M_p;
      if (iVar7 == 0) break;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar14 + -1);
      lVar16 = (long)paVar17 - (long)_Var4._M_p;
      if (((type_info *)local_1e8._M_string_length != (type_info *)(lVar16 + 1)) &&
         (sVar11 = local_1e8._M_string_length - (lVar16 + 1), sVar11 != 0)) {
        ptVar12 = (type_info *)(_Var4._M_p + lVar16);
        if (sVar11 == 1) {
          *ptVar12 = ptVar12[1];
        }
        else {
          memmove(ptVar12,(type_info *)(_Var4._M_p + lVar16 + 1),sVar11);
        }
      }
      ptVar12 = (type_info *)(local_1e8._M_string_length + -1);
      ((type_info *)(local_1e8._M_dataplus._M_p + -1))[local_1e8._M_string_length] = (type_info)0x0;
      ptVar14 = (type_info *)(local_1e8._M_dataplus._M_p + lVar16);
      _Var13._M_p = local_1e8._M_dataplus._M_p;
      local_1e8._M_string_length = (size_type)ptVar12;
    } while (paVar17 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var4._M_p);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  if (_Var13._M_p == local_1e8._M_dataplus._M_p) {
    local_358._8_8_ = local_1e8.field_2._8_8_;
    _Var13._M_p = (pointer)&local_358;
  }
  local_358._M_allocated_capacity = local_1e8.field_2._M_allocated_capacity;
  local_360 = (type_info *)local_1e8._M_string_length;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity =
       local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p;
  GetTypeName_abi_cxx11_
            ((string *)local_3b8,
             (internal *)
             &unodb::
              olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar12);
  auVar3 = local_3b8;
  local_b0.file._M_dataplus._M_p = (pointer)&local_b0.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  iVar7 = local_38;
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_b0.line = local_38;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog(&local_5c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(_Var4._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var4._M_p,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog(&local_5c);
  }
  iVar7 = local_38;
  _Var4._M_p = local_58._M_dataplus._M_p;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog(&local_5c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(_Var4._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var4._M_p,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog(&local_5c);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002517b8;
  MakeAndRegisterTestInfo
            (&local_140,_Var13._M_p,(char *)auVar3,(char *)0x0,&local_b0,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.file._M_dataplus._M_p != &local_b0.file.field_2) {
    operator_delete(local_b0.file._M_dataplus._M_p,local_b0.file.field_2._M_allocated_capacity + 1);
  }
  if (local_3b8 != (undefined1  [8])&local_3a8) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,(size_t)(local_358._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,
                    CONCAT71(local_3d8.field_2._M_allocated_capacity._1_7_,
                             local_3d8.field_2._M_local_buf[0]) + 1);
  }
  uVar5 = local_58.field_2._M_allocated_capacity;
  paVar17 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar17) {
    local_d8.field_2._8_8_ = local_58.field_2._8_8_;
    local_58._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  local_d8.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
  local_d8._M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_b8 = local_38;
  local_d8._M_dataplus._M_p = local_58._M_dataplus._M_p;
  _Var13._M_p = (pointer)paVar17;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_58._M_dataplus._M_p != &local_d8.field_2) &&
     (paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p, local_58._M_dataplus._M_p = (pointer)paVar17,
     operator_delete(paVar10,uVar5 + 1), _Var13._M_p = local_58._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_58._M_dataplus._M_p != paVar17)) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    _Var13._M_p = local_58._M_dataplus._M_p;
  }
  local_58._M_dataplus._M_p = _Var13._M_p;
  if (local_88 != (undefined1  [8])&local_78) {
    operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200._M_allocated_capacity + 1);
  }
  paVar17 = &local_250;
  if (local_260 != paVar17) {
    operator_delete(local_260,local_250._M_allocated_capacity + 1);
    paVar17 = extraout_RAX;
  }
  return SUB81(paVar17,0);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }